

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::FieldConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  long lVar1;
  long *plVar2;
  FieldDescriptor *pFVar3;
  char *pcVar4;
  size_type *psVar5;
  long *plVar6;
  string field_name;
  long *local_b8;
  long local_a8;
  long lStack_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_48;
  
  UnderscoresToCamelCase(&local_48,*(string **)(this + 8),true);
  std::operator+(&local_78,"k",&local_48);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  buffer = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != buffer) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (((byte)this[1] & 8) == 0) {
    pFVar3 = Descriptor::FindFieldByCamelcaseName
                       (*(Descriptor **)(this + 0x20),
                        (ConstStringParam)
                        ((ulong)(((byte)this[3] & 0xc) << 3) + *(long *)(this + 8)));
    if (pFVar3 != (FieldDescriptor *)this) {
      local_78._M_dataplus._M_p = (pointer)buffer;
      pcVar4 = FastInt32ToBufferLeft(*(int32 *)(this + 4),buffer->_M_local_buf);
      local_78._M_string_length = (long)pcVar4 - (long)buffer;
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x3f78b5);
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_a8 = *plVar6;
        lStack_a0 = plVar2[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar6;
        local_b8 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldConstantName(const FieldDescriptor* field) {
  std::string field_name = UnderscoresToCamelCase(field->name(), true);
  std::string result = "k" + field_name + "FieldNumber";

  if (!field->is_extension() &&
      field->containing_type()->FindFieldByCamelcaseName(
          field->camelcase_name()) != field) {
    // This field's camelcase name is not unique.  As a hack, add the field
    // number to the constant name.  This makes the constant rather useless,
    // but what can we do?
    result += "_" + StrCat(field->number());
  }

  return result;
}